

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

IPV6 * Network::Address::IPV6::queryNameServer
                 (IPV6 *__return_storage_ptr__,String *host,TimeOut *timeout)

{
  in_port_t iVar1;
  sockaddr *psVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  String port;
  addrinfo *res;
  addrinfo hints;
  String local_80;
  addrinfo *local_70;
  String local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if ((timeout->remainingTime < 1) || (timeout->remainingTime != 3000)) {
LAB_0010da27:
    (__return_storage_ptr__->super_BaseAddress)._vptr_BaseAddress =
         (_func_int **)&PTR_asText_001311e8;
    *(undefined1 (*) [16])&__return_storage_ptr__->address = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&(__return_storage_ptr__->address).sin6_addr.__in6_u + 4) =
         (undefined1  [16])0x0;
    (__return_storage_ptr__->address).sin6_family = 10;
    (__return_storage_ptr__->address).sin6_port = 0;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[0] = 0xffffffff;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[1] = 0xffffffff;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[2] = 0xffffffff;
    (__return_storage_ptr__->address).sin6_addr.__in6_u.__u6_addr32[3] = 0xffffffff;
  }
  else {
    local_38 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    local_70 = (addrinfo *)0x0;
    local_58 = ZEXT816(0xa00000004);
    Bstrlib::String::String(&local_68,"]");
    Bstrlib::String::upToFirst(&local_80,host,SUB81(&local_68,0));
    iVar5 = getaddrinfo((char *)local_80.super_tagbstring.data,(char *)0x0,(addrinfo *)local_58,
                        &local_70);
    Bstrlib::String::~String(&local_80);
    Bstrlib::String::~String(&local_68);
    if (iVar5 != 0) {
      auVar4._12_4_ = 0;
      auVar4._0_12_ = local_58._4_12_;
      local_58 = auVar4 << 0x20;
      Bstrlib::String::String(&local_68,"]");
      Bstrlib::String::upToFirst(&local_80,host,SUB81(&local_68,0));
      iVar5 = getaddrinfo((char *)local_80.super_tagbstring.data,(char *)0x0,(addrinfo *)local_58,
                          &local_70);
      Bstrlib::String::~String(&local_80);
      Bstrlib::String::~String(&local_68);
      if (iVar5 != 0) goto LAB_0010da27;
    }
    Bstrlib::String::String(&local_68,"]");
    Bstrlib::String::fromFirst(&local_80,host,SUB81(&local_68,0));
    Bstrlib::String::~String(&local_68);
    if (((local_70->ai_family == 10) && (*(short *)local_70->ai_addr->sa_data == 0)) &&
       (local_80.super_tagbstring.slen != 0)) {
      uVar6 = Bstrlib::String::operator_cast_to_unsigned_int(&local_80);
      *(ushort *)local_70->ai_addr->sa_data = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
    }
    psVar2 = local_70->ai_addr;
    iVar1 = *(in_port_t *)psVar2->sa_data;
    (__return_storage_ptr__->super_BaseAddress)._vptr_BaseAddress =
         (_func_int **)&PTR_asText_001311e8;
    *(undefined1 (*) [16])&__return_storage_ptr__->address = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&(__return_storage_ptr__->address).sin6_addr.__in6_u + 4) =
         (undefined1  [16])0x0;
    uVar3 = *(undefined8 *)(psVar2 + 1);
    *(undefined8 *)&(__return_storage_ptr__->address).sin6_addr.__in6_u =
         *(undefined8 *)(psVar2->sa_data + 6);
    *(undefined8 *)((long)&(__return_storage_ptr__->address).sin6_addr.__in6_u + 8) = uVar3;
    (__return_storage_ptr__->address).sin6_family = 10;
    (__return_storage_ptr__->address).sin6_port = iVar1;
    freeaddrinfo(local_70);
    Bstrlib::String::~String(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

IPV6 IPV6::queryNameServer(const String & host, const Time::TimeOut & timeout)
        {
            if (timeout <= 0) return IPV6();
#ifndef NEXIO
            if (timeout == DefaultTimeOut)
            {
                struct addrinfo hints = {0}, *res = 0;
                hints.ai_family = AF_INET6;
                hints.ai_flags = AI_NUMERICHOST;

                // First try without resolving the domain name
                if (getaddrinfo((const char*)host.upToFirst("]", true), NULL, &hints, &res) != 0)
                {
                    // Ok, then resolve
                    hints.ai_flags = 0;
                    if (getaddrinfo((const char*)host.upToFirst("]", true), NULL, &hints, &res) != 0)
                        return IPV6();
                }
                String port = host.fromFirst("]");
                if (res[0].ai_family == AF_INET6 && !((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port && port.getLength())
                    ((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port = htons((unsigned int)port);


                IPV6 result((const uint8*)((struct sockaddr_in6 *)res[0].ai_addr)->sin6_addr.s6_addr, (uint16)ntohs(((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port));
                freeaddrinfo(res);
                return result;
            }
#endif
            // Not implemented yet with a timeout
            return IPV6();
        }